

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamState.cpp
# Opt level: O2

void __thiscall
TasDREAM::TasmanianDREAM::getApproximateMode
          (TasmanianDREAM *this,vector<double,_std::allocator<double>_> *mode)

{
  size_t sVar1;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> _Var2;
  
  _Var2 = std::
          __max_element<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    ((this->pdf_history).super__Vector_base<double,_std::allocator<double>_>._M_impl
                     .super__Vector_impl_data._M_start,
                     (this->pdf_history).super__Vector_base<double,_std::allocator<double>_>._M_impl
                     .super__Vector_impl_data._M_finish);
  std::vector<double,_std::allocator<double>_>::resize(mode,this->num_dimensions);
  sVar1 = this->num_dimensions;
  if (sVar1 != 0) {
    memmove((mode->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start,
            (this->history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start +
            ((ulong)((long)_Var2._M_current -
                    (long)(this->pdf_history).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3) * sVar1,sVar1 << 3);
    return;
  }
  return;
}

Assistant:

void TasmanianDREAM::getApproximateMode(std::vector<double> &mode) const{
    auto imax = std::max_element(pdf_history.begin(), pdf_history.end());
    mode.resize(num_dimensions);
    std::copy_n(history.begin() + std::distance(pdf_history.begin(), imax) * num_dimensions, num_dimensions, mode.data());
}